

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# route.c
# Opt level: O1

void init_route(route_t *record)

{
  record->id[0] = '\0';
  record->agency_id[0] = '\0';
  record->short_name[0] = '\0';
  record->long_name[0] = '\0';
  record->desc[0] = '\0';
  record->type = RT_NOT_SET;
  record->url[0] = '\0';
  record->color[0] = '\0';
  record->text_color[0] = '\0';
  record->sort_order = 0;
  return;
}

Assistant:

void init_route(route_t *record) {
    strcpy(record->id, "");
    strcpy(record->agency_id, "");
    strcpy(record->short_name, "");
    strcpy(record->long_name, "");
    strcpy(record->desc, "");
    record->type = RT_NOT_SET;
    strcpy(record->url, "");
    strcpy(record->color, "");
    strcpy(record->text_color, "");
    record->sort_order = 0;
}